

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

UChar32 __thiscall icu_63::RBBIRuleScanner::nextCharLL(RBBIRuleScanner *this)

{
  short sVar1;
  UnicodeString *this_00;
  RBBIRuleBuilder *pRVar2;
  UErrorCode *pUVar3;
  UParseError *pUVar4;
  UChar32 UVar5;
  int32_t iVar6;
  int iVar7;
  
  this_00 = this->fRB->fRules;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (iVar6 <= this->fNextIndex) {
    return -1;
  }
  UVar5 = UnicodeString::char32At(this_00,this->fNextIndex);
  iVar6 = UnicodeString::moveIndex32(this->fRB->fRules,this->fNextIndex,1);
  this->fNextIndex = iVar6;
  if (UVar5 < 0x85) {
    if (UVar5 == 10) {
      if (this->fLastChar == 0xd) goto LAB_002ad06c;
    }
    else if (UVar5 != 0xd) goto LAB_002ad01f;
  }
  else if ((UVar5 != 0x85) && (UVar5 != 0x2028)) {
LAB_002ad01f:
    this->fCharNum = this->fCharNum + 1;
    goto LAB_002ad06c;
  }
  iVar7 = this->fLineNum + 1;
  this->fLineNum = iVar7;
  this->fCharNum = 0;
  if (this->fQuoteMode != '\0') {
    pRVar2 = this->fRB;
    pUVar3 = pRVar2->fStatus;
    if (*pUVar3 < U_ILLEGAL_ARGUMENT_ERROR) {
      *pUVar3 = U_BRK_NEW_LINE_IN_QUOTED_STRING;
      pUVar4 = pRVar2->fParseError;
      if (pUVar4 != (UParseError *)0x0) {
        pUVar4->line = iVar7;
        pUVar4->offset = 0;
        pUVar4->preContext[0] = L'\0';
        pUVar4->postContext[0] = L'\0';
      }
    }
    this->fQuoteMode = '\0';
  }
LAB_002ad06c:
  this->fLastChar = UVar5;
  return UVar5;
}

Assistant:

UChar32  RBBIRuleScanner::nextCharLL() {
    UChar32  ch;

    if (fNextIndex >= fRB->fRules.length()) {
        return (UChar32)-1;
    }
    ch         = fRB->fRules.char32At(fNextIndex);
    fNextIndex = fRB->fRules.moveIndex32(fNextIndex, 1);

    if (ch == chCR ||
        ch == chNEL ||
        ch == chLS   ||
        (ch == chLF && fLastChar != chCR)) {
        // Character is starting a new line.  Bump up the line number, and
        //  reset the column to 0.
        fLineNum++;
        fCharNum=0;
        if (fQuoteMode) {
            error(U_BRK_NEW_LINE_IN_QUOTED_STRING);
            fQuoteMode = FALSE;
        }
    }
    else {
        // Character is not starting a new line.  Except in the case of a
        //   LF following a CR, increment the column position.
        if (ch != chLF) {
            fCharNum++;
        }
    }
    fLastChar = ch;
    return ch;
}